

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
cpprofiler::MessageMarshalling::serialize
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,MessageMarshalling *this)

{
  int32_t iVar1;
  undefined4 i;
  undefined4 i_00;
  undefined4 i_01;
  undefined4 i_02;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = 0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = (this->msg)._label._M_string_length + 5;
  if ((this->msg)._have_label == false) {
    lVar3 = lVar2;
  }
  lVar4 = lVar3 + 0x22;
  if ((this->msg)._type != NODE) {
    lVar4 = lVar3 + 1;
  }
  lVar3 = (this->msg)._nogood._M_string_length + 5;
  if ((this->msg)._have_nogood == false) {
    lVar3 = lVar2;
  }
  lVar5 = (this->msg)._info._M_string_length + 5;
  if ((this->msg)._have_info == false) {
    lVar5 = lVar2;
  }
  std::vector<char,_std::allocator<char>_>::reserve(__return_storage_ptr__,lVar5 + lVar3 + lVar4);
  serializeType(__return_storage_ptr__,(this->msg)._type);
  if ((this->msg)._type == NODE) {
    i = (this->msg)._node.nid;
    i_01 = (this->msg)._node.rid;
    iVar1 = (this->msg)._node.tid;
    serialize(__return_storage_ptr__,i);
    serialize(__return_storage_ptr__,i_01);
    serialize(__return_storage_ptr__,iVar1);
    i_00 = (this->msg)._parent.nid;
    i_02 = (this->msg)._parent.rid;
    iVar1 = (this->msg)._parent.tid;
    serialize(__return_storage_ptr__,i_00);
    serialize(__return_storage_ptr__,i_02);
    serialize(__return_storage_ptr__,iVar1);
    serialize(__return_storage_ptr__,(this->msg)._alt);
    serialize(__return_storage_ptr__,(this->msg)._kids);
    serialize(__return_storage_ptr__,(this->msg)._status);
  }
  if ((this->msg)._have_version == true) {
    serializeField(__return_storage_ptr__,VERSION);
    serialize(__return_storage_ptr__,(this->msg)._version);
  }
  if ((this->msg)._have_label == true) {
    serializeField(__return_storage_ptr__,LABEL);
    serialize(__return_storage_ptr__,&(this->msg)._label);
  }
  if ((this->msg)._have_nogood == true) {
    serializeField(__return_storage_ptr__,NOGOOD);
    serialize(__return_storage_ptr__,&(this->msg)._nogood);
  }
  if ((this->msg)._have_info == true) {
    serializeField(__return_storage_ptr__,INFO);
    serialize(__return_storage_ptr__,&(this->msg)._info);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> serialize(void) const {
    std::vector<char> data;
    size_t dataSize = 1 + (msg.isNode() ? 4 * 8 + 1 : 0) +
        (msg.has_label() ? 1 + 4 + msg.label().size() : 0) +
        (msg.has_nogood() ? 1 + 4 + msg.nogood().size() : 0) +
        (msg.has_info() ? 1 + 4 + msg.info().size() : 0);
    data.reserve(dataSize);

    serializeType(data, msg.type());
    if (msg.isNode()) {
      // serialize NodeId node
      auto n_uid = msg.nodeUID();
      serialize(data, n_uid.nid);
      serialize(data, n_uid.rid);
      serialize(data, n_uid.tid);
      // serialize NodeId parent
      auto p_uid = msg.parentUID();
      serialize(data, p_uid.nid);
      serialize(data, p_uid.rid);
      serialize(data, p_uid.tid);
      // Other Data
      serialize(data, msg.alt());
      serialize(data, msg.kids());
      serialize(data, msg.status());
    }

    if(msg.has_version()) {
      serializeField(data, VERSION);
      serialize(data, msg.version());
    }
    if (msg.has_label()) {
      serializeField(data, LABEL);
      serialize(data, msg.label());
    }
    if (msg.has_nogood()) {
      serializeField(data, NOGOOD);
      serialize(data, msg.nogood());
    }
    if (msg.has_info()) {
      serializeField(data, INFO);
      serialize(data, msg.info());
    }
    return data;
  }